

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

void __thiscall QPushButton::focusInEvent(QPushButton *this,QFocusEvent *e)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QWidget *object;
  QDialog *pQVar5;
  
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  iVar4 = QFocusEvent::reason();
  if (iVar4 != 4) {
    bVar3 = autoDefault(this);
    if ((bVar3) && (bVar1 = *(byte *)(lVar2 + 0x2c8), (bVar1 & 4) == 0)) {
      *(byte *)(lVar2 + 0x2c8) = bVar1 | 4;
      object = QWidget::window((QWidget *)this);
      pQVar5 = QtPrivate::qobject_cast_helper<QDialog*,QObject>(&object->super_QObject);
      if (pQVar5 != (QDialog *)0x0) {
        QDialogPrivate::setDefault(*(QDialogPrivate **)&(pQVar5->super_QWidget).field_0x8,this);
      }
    }
  }
  QAbstractButton::focusInEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QPushButton::focusInEvent(QFocusEvent *e)
{
    Q_D(QPushButton);
    if (e->reason() != Qt::PopupFocusReason && autoDefault() && !d->defaultButton) {
        d->defaultButton = true;
#if QT_CONFIG(dialog)
        QDialog *dlg = qobject_cast<QDialog*>(window());
        if (dlg)
            dlg->d_func()->setDefault(this);
#endif
    }
    QAbstractButton::focusInEvent(e);
}